

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

int Fra_ClassesCountPairs(Fra_Cla_t *p)

{
  int iVar1;
  Aig_Obj_t **pClass;
  int i;
  int iVar2;
  
  i = 0;
  iVar2 = 0;
  while( true ) {
    if (p->vClasses->nSize <= i) {
      return iVar2;
    }
    pClass = (Aig_Obj_t **)Vec_PtrEntry(p->vClasses,i);
    iVar1 = Fra_ClassCount(pClass);
    if (iVar1 < 2) break;
    iVar2 = iVar2 + ((uint)((iVar1 + -1) * iVar1) >> 1);
    i = i + 1;
  }
  __assert_fail("nNodes > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0xc4,"int Fra_ClassesCountPairs(Fra_Cla_t *)");
}

Assistant:

int Fra_ClassesCountPairs( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass;
    int i, nNodes, nPairs = 0;
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        nNodes = Fra_ClassCount( pClass );
        assert( nNodes > 1 );
        nPairs += nNodes * (nNodes - 1) / 2;
    }
    return nPairs;
}